

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O0

bool __thiscall haVoc::QMoveorder::valid_qmove(QMoveorder *this,Move *m)

{
  bool local_19;
  Move *m_local;
  QMoveorder *this_local;
  
  local_19 = true;
  if ((((((this->super_Moveorder).m_incheck & 1U) == 0) && (local_19 = true, m->type != '\v')) &&
      (local_19 = true, m->type != '\f')) &&
     (((local_19 = true, m->type != '\x04' && (local_19 = true, m->type != '\x05')) &&
      (local_19 = true, m->type != '\x06')))) {
    local_19 = m->type == '\a';
  }
  return local_19;
}

Assistant:

bool QMoveorder::valid_qmove(const Move& m) {
		return m_incheck ||
			m.type == Movetype::capture ||
			m.type == Movetype::ep ||
			m.type == Movetype::capture_promotion_q ||
			m.type == Movetype::capture_promotion_r ||
			m.type == Movetype::capture_promotion_b ||
			m.type == Movetype::capture_promotion_n;
	}